

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-printing.h
# Opt level: O1

Printed * __thiscall
wasm::
TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
::operator()(Printed *__return_storage_ptr__,
            TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
            *this,HeapType type)

{
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<wasm::TypeNames_(wasm::HeapType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type-printing.h:42:7)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<wasm::TypeNames_(wasm::HeapType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type-printing.h:42:7)>
             ::_M_manager;
  __return_storage_ptr__->typeID = type.id;
  local_38._M_unused._0_8_ = (undefined8)this;
  std::function<wasm::TypeNames_(wasm::HeapType)>::function
            (&__return_storage_ptr__->generateName,
             (function<wasm::TypeNames_(wasm::HeapType)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

HeapType::Printed operator()(HeapType type) {
    return type.print(
      [&](HeapType ht) { return static_cast<Subclass*>(this)->getNames(ht); });
  }